

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O3

HighsDomain * __thiscall HighsDomain::operator=(HighsDomain *this,HighsDomain *other)

{
  _Elt_pointer pCVar1;
  _Elt_pointer pCVar2;
  HighsObjectiveFunction *pHVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  HighsInt HVar9;
  undefined4 uVar10;
  CutpoolPropagation *cutpoolprop;
  _Elt_pointer pCVar11;
  ConflictPoolPropagation *conflictprop;
  _Map_pointer ppCVar12;
  _Elt_pointer pCVar13;
  _Elt_pointer pCVar14;
  _Map_pointer ppCVar15;
  _Elt_pointer pCVar16;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->changedcolsflags_,&other->changedcolsflags_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->changedcols_,&other->changedcols_);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator=
            (&this->domchgstack_,&other->domchgstack_);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator=
            (&this->domchgreason_,&other->domchgreason_);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::operator=
            (&this->prevboundval_,&other->prevboundval_);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (&this->activitymin_,&other->activitymin_);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (&this->activitymax_,&other->activitymax_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->activitymininf_,&other->activitymininf_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->activitymaxinf_,&other->activitymaxinf_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->capacityThreshold_,&other->capacityThreshold_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->propagateflags_,&other->propagateflags_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->propagateinds_,&other->propagateinds_);
  pHVar3 = (other->objProp_).objFunc;
  pdVar4 = (other->objProp_).cost;
  dVar5 = (other->objProp_).objectiveLower.hi;
  dVar6 = (other->objProp_).objectiveLower.lo;
  HVar9 = (other->objProp_).numInfObjLower;
  uVar10 = *(undefined4 *)&(other->objProp_).field_0x2c;
  uVar7 = *(undefined8 *)((long)&(other->objProp_).numInfObjLower + 1);
  uVar8 = *(undefined8 *)((long)&(other->objProp_).capacityThreshold + 1);
  (this->objProp_).domain = (other->objProp_).domain;
  (this->objProp_).objFunc = pHVar3;
  (this->objProp_).cost = pdVar4;
  (this->objProp_).objectiveLower.hi = dVar5;
  (this->objProp_).objectiveLower.lo = dVar6;
  (this->objProp_).numInfObjLower = HVar9;
  *(undefined4 *)&(this->objProp_).field_0x2c = uVar10;
  *(undefined8 *)((long)&(this->objProp_).numInfObjLower + 1) = uVar7;
  *(undefined8 *)((long)&(this->objProp_).capacityThreshold + 1) = uVar8;
  std::
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ::operator=(&(this->objProp_).objectiveLowerContributions,
              &(other->objProp_).objectiveLowerContributions);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator=
            (&(this->objProp_).contributionPartitionSets,
             &(other->objProp_).contributionPartitionSets);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->objProp_).propagationConsBuffer,&(other->objProp_).propagationConsBuffer);
  std::
  vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ::operator=(&(this->objProp_).partitionCliqueData,&(other->objProp_).partitionCliqueData);
  this->mipsolver = other->mipsolver;
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
  operator=(&this->cutpoolpropagation,&other->cutpoolpropagation);
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::operator=(&this->conflictPoolPropagation,&other->conflictPoolPropagation);
  this->infeasible_ = other->infeasible_;
  this->infeasible_reason = other->infeasible_reason;
  std::vector<int,_std::allocator<int>_>::operator=(&this->colLowerPos_,&other->colLowerPos_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->colUpperPos_,&other->colUpperPos_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->branchPos_,&other->branchPos_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->col_lower_,&other->col_lower_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->col_upper_,&other->col_upper_);
  pCVar11 = (this->cutpoolpropagation).
            super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pCVar1 = (this->cutpoolpropagation).
           super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pCVar11 != pCVar1) {
    pCVar14 = (this->cutpoolpropagation).
              super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppCVar12 = (this->cutpoolpropagation).
               super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pCVar11->domain = this;
      pCVar11 = pCVar11 + 1;
      if (pCVar11 == pCVar14) {
        pCVar11 = ppCVar12[1];
        ppCVar12 = ppCVar12 + 1;
        pCVar14 = pCVar11 + 3;
      }
    } while (pCVar11 != pCVar1);
  }
  pCVar13 = (this->conflictPoolPropagation).
            super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pCVar2 = (this->conflictPoolPropagation).
           super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pCVar13 != pCVar2) {
    pCVar16 = (this->conflictPoolPropagation).
              super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppCVar15 = (this->conflictPoolPropagation).
               super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      pCVar13->domain = this;
      pCVar13 = pCVar13 + 1;
      if (pCVar13 == pCVar16) {
        pCVar13 = ppCVar15[1];
        ppCVar15 = ppCVar15 + 1;
        pCVar16 = pCVar13 + 3;
      }
    } while (pCVar13 != pCVar2);
  }
  if ((this->objProp_).domain != (HighsDomain *)0x0) {
    (this->objProp_).domain = this;
  }
  return this;
}

Assistant:

HighsDomain& operator=(const HighsDomain& other) {
    changedcolsflags_ = other.changedcolsflags_;
    changedcols_ = other.changedcols_;
    domchgstack_ = other.domchgstack_;
    domchgreason_ = other.domchgreason_;
    prevboundval_ = other.prevboundval_;
    activitymin_ = other.activitymin_;
    activitymax_ = other.activitymax_;
    activitymininf_ = other.activitymininf_;
    activitymaxinf_ = other.activitymaxinf_;
    capacityThreshold_ = other.capacityThreshold_;
    propagateflags_ = other.propagateflags_;
    propagateinds_ = other.propagateinds_;
    objProp_ = other.objProp_;
    mipsolver = other.mipsolver;
    cutpoolpropagation = other.cutpoolpropagation;
    conflictPoolPropagation = other.conflictPoolPropagation;
    infeasible_ = other.infeasible_;
    infeasible_reason = other.infeasible_reason;
    colLowerPos_ = other.colLowerPos_;
    colUpperPos_ = other.colUpperPos_;
    branchPos_ = other.branchPos_;
    col_lower_ = other.col_lower_;
    col_upper_ = other.col_upper_;
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.domain = this;
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.domain = this;
    if (objProp_.domain) objProp_.domain = this;
    return *this;
  }